

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

string * test_sprintf<signed_char>(string *__return_storage_ptr__,string_view format,char *args)

{
  char *local_18;
  size_t local_10;
  
  local_10 = format.size_;
  local_18 = format.data_;
  fmt::v5::sprintf<fmt::v5::basic_string_view<char>,signed_char>
            (__return_storage_ptr__,(v5 *)&local_18,(basic_string_view<char> *)args,args);
  return __return_storage_ptr__;
}

Assistant:

std::string test_sprintf(fmt::string_view format, const Args &... args) {
  return fmt::sprintf(format, args...);
}